

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

ON_ClippingPlaneInfo * __thiscall
ON_ClippingPlane::ClippingPlaneInfo
          (ON_ClippingPlaneInfo *__return_storage_ptr__,ON_ClippingPlane *this)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  double depth;
  ON_ClippingPlaneInfo *info;
  ON_ClippingPlane *this_local;
  
  ON_ClippingPlaneInfo::ON_ClippingPlaneInfo(__return_storage_ptr__);
  (__return_storage_ptr__->m_plane_equation).x = (this->m_plane).plane_equation.x;
  (__return_storage_ptr__->m_plane_equation).y = (this->m_plane).plane_equation.y;
  (__return_storage_ptr__->m_plane_equation).z = (this->m_plane).plane_equation.z;
  (__return_storage_ptr__->m_plane_equation).d = (this->m_plane).plane_equation.d;
  uVar1 = (this->m_plane_id).Data2;
  uVar2 = (this->m_plane_id).Data3;
  (__return_storage_ptr__->m_plane_id).Data1 = (this->m_plane_id).Data1;
  (__return_storage_ptr__->m_plane_id).Data2 = uVar1;
  (__return_storage_ptr__->m_plane_id).Data3 = uVar2;
  *(undefined8 *)(__return_storage_ptr__->m_plane_id).Data4 =
       *(undefined8 *)(this->m_plane_id).Data4;
  __return_storage_ptr__->m_bEnabled = (bool)(this->m_bEnabled & 1);
  depth = Depth(this);
  ON_ClippingPlaneInfo::SetDepth(__return_storage_ptr__,depth);
  ON_ClippingPlaneInfo::SetDepthEnabled(__return_storage_ptr__,(bool)(this->m_depth_enabled & 1));
  return __return_storage_ptr__;
}

Assistant:

ON_ClippingPlaneInfo ON_ClippingPlane::ClippingPlaneInfo() const
{
  ON_ClippingPlaneInfo info;
  info.m_plane_equation = m_plane.plane_equation;
  info.m_plane_id = m_plane_id;
  info.m_bEnabled = m_bEnabled;
  info.SetDepth(Depth());
  info.SetDepthEnabled(m_depth_enabled);
  return info;
}